

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers_test.cpp
# Opt level: O2

void __thiscall
PMJ02BNSampler_ElementaryIntervals_Test::TestBody(PMJ02BNSampler_ElementaryIntervals_Test *this)

{
  ulong in_RAX;
  PMJ02BNSampler *this_00;
  Allocator alloc;
  uint logSamples;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_38;
  
  local_38.bits = in_RAX;
  for (logSamples = 2; logSamples < 0xb; logSamples = logSamples + 2) {
    this_00 = (PMJ02BNSampler *)operator_new(0x28);
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::PMJ02BNSampler::PMJ02BNSampler(this_00,1 << (logSamples & 0x1f),0,alloc);
    local_38.bits = (ulong)this_00 | 0x7000000000000;
    checkElementarySampler
              ("PMJ02BNSampler",(SamplerHandle *)&local_38,logSamples,(int)alloc.memoryResource);
  }
  return;
}

Assistant:

TEST(PMJ02BNSampler, ElementaryIntervals) {
    for (int logSamples = 2; logSamples <= 10; logSamples += 2)
        checkElementarySampler("PMJ02BNSampler", new PMJ02BNSampler(1 << logSamples),
                               logSamples);
}